

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_WriteTypedArray(BCWriterState *s,JSValue obj)

{
  DynBuf *s_00;
  long lVar1;
  int iVar2;
  JSValueUnion JVar3;
  JSValue obj_00;
  
  JVar3 = obj.u;
  lVar1 = *(long *)((long)JVar3.ptr + 0x30);
  s_00 = &s->dbuf;
  dbuf_putc(s_00,'\x10');
  dbuf_putc(s_00,*(char *)((long)JVar3.ptr + 6) + 0xeb);
  dbuf_put_leb128(s_00,*(uint32_t *)((long)JVar3.ptr + 0x40));
  dbuf_put_leb128(s_00,*(uint32_t *)(lVar1 + 0x20));
  obj_00.tag = -1;
  obj_00.u.ptr = ((JSValueUnion *)(lVar1 + 0x18))->ptr;
  iVar2 = JS_WriteObjectRec(s,obj_00);
  return -(uint)(iVar2 != 0);
}

Assistant:

static int JS_WriteTypedArray(BCWriterState *s, JSValueConst obj)
{
    JSObject *p = JS_VALUE_GET_OBJ(obj);
    JSTypedArray *ta = p->u.typed_array;

    bc_put_u8(s, BC_TAG_TYPED_ARRAY);
    bc_put_u8(s, p->class_id - JS_CLASS_UINT8C_ARRAY);
    bc_put_leb128(s, p->u.array.count);
    bc_put_leb128(s, ta->offset);
    if (JS_WriteObjectRec(s, JS_MKPTR(JS_TAG_OBJECT, ta->buffer)))
        return -1;
    return 0;
}